

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateFunctionCall3(ExpressionContext *ctx,SynBase *source,InplaceStr name,ExprBase *arg0,
                   ExprBase *arg1,ExprBase *arg2,bool allowFailure,bool allowInternal,
                   bool allowFastLookup)

{
  Allocator *pAVar1;
  ExprBase *pEVar2;
  long lVar3;
  ArrayView<ArgumentData> arguments_00;
  char *local_e8;
  char *local_e0;
  SmallArray<ArgumentData,_3U> arguments;
  
  local_e0 = name.end;
  local_e8 = name.begin;
  pAVar1 = ctx->allocator;
  lVar3 = 0x20;
  do {
    *(undefined8 *)((long)&local_e8 + lVar3) = 0;
    *(undefined1 *)((long)arguments.little + lVar3 + -0x18) = 0;
    *(undefined8 *)((long)arguments.little + lVar3 + -0x10) = 0;
    *(undefined8 *)((long)arguments.little + lVar3 + -8) = 0;
    *(undefined8 *)((long)&arguments.little[0].source + lVar3) = 0;
    *(undefined8 *)(&arguments.little[0].isExplicit + lVar3) = 0;
    lVar3 = lVar3 + 0x30;
  } while (lVar3 != 0xb0);
  arguments.data = arguments.little;
  arguments.little[0].source = arg0->source;
  arguments.little[0].type = arg0->type;
  arguments.count = 1;
  arguments.little[0].value = arg0;
  arguments.allocator = pAVar1;
  if (arguments.data != (ArgumentData *)0x0) {
    arguments.little[1].isExplicit = false;
    arguments.little[1].name = (SynIdentifier *)0x0;
    arguments.little[1].valueFunction = (FunctionData *)0x0;
    arguments.little[2].source = arg2->source;
    arguments.little[2].type = arg2->type;
    arguments.little[0].valueFunction = (FunctionData *)0x0;
    arguments.little[0].name = (SynIdentifier *)0x0;
    arguments.little[0].isExplicit = false;
    arguments.max = 3;
    arguments.count = 2;
    arguments.little[1].source = arg1->source;
    arguments.little[1].type = arg1->type;
    arguments.little[1].value = arg1;
    if (arguments.data != (ArgumentData *)0x0) {
      arguments.count = 3;
      arguments.little[2].isExplicit = false;
      arguments.little[2].name = (SynIdentifier *)0x0;
      arguments.little[2].value = arg2;
      arguments.little[2].valueFunction = (FunctionData *)0x0;
      arguments_00.count = 3;
      arguments_00.data = arguments.data;
      arguments_00._12_4_ = 0;
      pEVar2 = CreateFunctionCallByName
                         (ctx,source,name,arguments_00,allowFailure,allowInternal,allowFastLookup);
      SmallArray<ArgumentData,_3U>::~SmallArray(&arguments);
      return pEVar2;
    }
  }
  arguments.little[0].valueFunction = (FunctionData *)0x0;
  arguments.little[0].name = (SynIdentifier *)0x0;
  arguments.little[0].isExplicit = false;
  arguments.max = 3;
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<ArgumentData, 3>::push_back(const T &) [T = ArgumentData, N = 3]");
}

Assistant:

ExprBase* CreateFunctionCall3(ExpressionContext &ctx, SynBase *source, InplaceStr name, ExprBase *arg0, ExprBase *arg1, ExprBase *arg2, bool allowFailure, bool allowInternal, bool allowFastLookup)
{
	SmallArray<ArgumentData, 3> arguments(ctx.allocator);

	arguments.push_back(ArgumentData(arg0->source, false, NULL, arg0->type, arg0));
	arguments.push_back(ArgumentData(arg1->source, false, NULL, arg1->type, arg1));
	arguments.push_back(ArgumentData(arg2->source, false, NULL, arg2->type, arg2));

	return CreateFunctionCallByName(ctx, source, name, arguments, allowFailure, allowInternal, allowFastLookup);
}